

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::qdxt1::pack(qdxt1 *this,dxt1_block *pDst_elements,uint elements_per_block,
                   qdxt1_params *params,float quality_power_mul)

{
  bool bVar1;
  uint uVar2;
  uint high;
  uint max_clusters;
  uint max_selector_clusters_00;
  crn_thread_id_t cVar3;
  vector<unsigned_int> *pvVar4;
  uint *puVar5;
  vector<crnlib::vector<unsigned_int>_> *this_00;
  float __x;
  float fVar6;
  float fVar7;
  uint local_8c;
  uint i_3;
  optimize_selectors_params optimize_selectors_task_params;
  uint local_6c;
  uint i_2;
  vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices;
  uint local_58;
  uint num;
  uint i_1;
  uint max_blocks;
  uint total_blocks;
  uint i;
  uint max_selector_clusters;
  uint max_endpoint_clusters;
  float selector_quality;
  float endpoint_quality;
  float quality;
  float quality_power_mul_local;
  qdxt1_params *params_local;
  uint elements_per_block_local;
  dxt1_block *pDst_elements_local;
  qdxt1 *this_local;
  
  cVar3 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar3;
  this->m_canceled = false;
  this->m_pDst_elements = pDst_elements;
  this->m_elements_per_block = elements_per_block;
  memcpy(&this->m_params,params,0x630);
  if (((this->m_params).m_use_alpha_blocks & 1U) == 0) {
    (this->m_params).m_dxt1a_alpha_threshold = 0;
  }
  this->m_prev_percentage_complete = -1;
  __x = (float)(this->m_params).m_quality_level / 255.0;
  fVar6 = powf(__x,quality_power_mul * 1.8);
  fVar7 = powf(__x,quality_power_mul * 1.65);
  uVar2 = clusterizer<crnlib::vec<6U,_float>_>::get_codebook_size(&this->m_endpoint_clusterizer);
  high = clusterizer<crnlib::vec<6U,_float>_>::get_codebook_size(&this->m_endpoint_clusterizer);
  max_clusters = math::clamp<unsigned_int>((uint)(long)((float)uVar2 * fVar6),0x60,high);
  max_selector_clusters_00 =
       math::clamp<unsigned_int>
                 ((uint)(long)((float)this->m_max_selector_clusters * fVar7),0x80,
                  this->m_max_selector_clusters);
  if (__x < 1.0) {
    clusterizer<crnlib::vec<6U,_float>_>::retrieve_clusters
              (&this->m_endpoint_clusterizer,max_clusters,&this->m_endpoint_cluster_indices);
  }
  else {
    vector<crnlib::vector<unsigned_int>_>::resize
              (&this->m_endpoint_cluster_indices,this->m_num_blocks,false);
    for (max_blocks = 0; max_blocks < this->m_num_blocks; max_blocks = max_blocks + 1) {
      pvVar4 = vector<crnlib::vector<unsigned_int>_>::operator[]
                         (&this->m_endpoint_cluster_indices,max_blocks);
      vector<unsigned_int>::resize(pvVar4,1,false);
      pvVar4 = vector<crnlib::vector<unsigned_int>_>::operator[]
                         (&this->m_endpoint_cluster_indices,max_blocks);
      puVar5 = vector<unsigned_int>::operator[](pvVar4,0);
      *puVar5 = max_blocks;
    }
  }
  num = 0;
  for (local_58 = 0;
      uVar2 = vector<crnlib::vector<unsigned_int>_>::size(&this->m_endpoint_cluster_indices),
      local_58 < uVar2; local_58 = local_58 + 1) {
    pvVar4 = vector<crnlib::vector<unsigned_int>_>::operator[]
                       (&this->m_endpoint_cluster_indices,local_58);
    uVar2 = vector<unsigned_int>::size(pvVar4);
    num = math::maximum<unsigned_int>(num,uVar2);
  }
  this_00 = this->m_cached_selector_cluster_indices + params->m_quality_level;
  this->m_progress_start = 0;
  if (__x < 1.0) {
    bVar1 = vector<crnlib::vector<unsigned_int>_>::empty(this_00);
    if (bVar1) {
      uVar2 = 0x21;
      if ((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) {
        uVar2 = 10;
      }
      this->m_progress_range = uVar2;
    }
    else {
      uVar2 = 0x32;
      if ((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) {
        uVar2 = 10;
      }
      this->m_progress_range = uVar2;
    }
  }
  else {
    this->m_progress_range = 100;
  }
  for (local_6c = 0; uVar2 = task_pool::get_num_threads(this->m_pTask_pool), local_6c <= uVar2;
      local_6c = local_6c + 1) {
    optimize_selectors_task_params.m_selector_cluster_indices =
         (vector<crnlib::vector<unsigned_int>_> *)pack_endpoints_task;
    task_pool::queue_object_task<crnlib::qdxt1,void(crnlib::qdxt1::*)(unsigned_long_long,void*)>
              (this->m_pTask_pool,this,0x158ad0,0,(void *)(ulong)local_6c);
  }
  task_pool::join(this->m_pTask_pool);
  if ((this->m_canceled & 1U) == 0) {
    if (__x < 1.0) {
      bVar1 = vector<crnlib::vector<unsigned_int>_>::empty(this_00);
      if ((bVar1) &&
         (create_selector_clusters(this,max_selector_clusters_00,this_00),
         (this->m_canceled & 1U) != 0)) {
        vector<crnlib::vector<unsigned_int>_>::clear(this_00);
        this_local._7_1_ = false;
      }
      else {
        this->m_progress_start = this->m_progress_range + this->m_progress_start;
        this->m_progress_range = 100 - this->m_progress_start;
        optimize_selectors_params::optimize_selectors_params
                  ((optimize_selectors_params *)&stack0xffffffffffffff78,this_00);
        for (local_8c = 0; uVar2 = task_pool::get_num_threads(this->m_pTask_pool), local_8c <= uVar2
            ; local_8c = local_8c + 1) {
          task_pool::
          queue_object_task<crnlib::qdxt1,void(crnlib::qdxt1::*)(unsigned_long_long,void*)>
                    (this->m_pTask_pool,this,0x1598d0,0,(void *)(ulong)local_8c);
        }
        task_pool::join(this->m_pTask_pool);
        this_local._7_1_ = (bool)((this->m_canceled ^ 0xffU) & 1);
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool qdxt1::pack(dxt1_block* pDst_elements, uint elements_per_block, const qdxt1_params& params, float quality_power_mul)
    {
        CRNLIB_ASSERT(m_num_blocks);

        m_main_thread_id = crn_get_current_thread_id();
        m_canceled = false;

        m_pDst_elements = pDst_elements;
        m_elements_per_block = elements_per_block;
        m_params = params;
        if (!m_params.m_use_alpha_blocks)
        {
            m_params.m_dxt1a_alpha_threshold = 0;
        }

        m_prev_percentage_complete = -1;

        CRNLIB_ASSERT(m_params.m_quality_level <= qdxt1_params::cMaxQuality);
        const float quality = m_params.m_quality_level / (float)qdxt1_params::cMaxQuality;
        const float endpoint_quality = powf(quality, 1.8f * quality_power_mul);
        const float selector_quality = powf(quality, 1.65f * quality_power_mul);

        //const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 128U, m_endpoint_clusterizer.get_codebook_size());
        //const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 150U, m_max_selector_clusters);
        const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 96U, m_endpoint_clusterizer.get_codebook_size());
        const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 128U, m_max_selector_clusters);

        if (quality >= 1.0f)
        {
            m_endpoint_cluster_indices.resize(m_num_blocks);
            for (uint i = 0; i < m_num_blocks; i++)
            {
                m_endpoint_cluster_indices[i].resize(1);
                m_endpoint_cluster_indices[i][0] = i;
            }
        }
        else
        {
            m_endpoint_clusterizer.retrieve_clusters(max_endpoint_clusters, m_endpoint_cluster_indices);
        }

        //      trace("endpoint clusters: %u\n", m_endpoint_cluster_indices.size());

        uint total_blocks = 0;
        uint max_blocks = 0;
        for (uint i = 0; i < m_endpoint_cluster_indices.size(); i++)
        {
            uint num = m_endpoint_cluster_indices[i].size();
            total_blocks += num;
            max_blocks = math::maximum(max_blocks, num);
        }
#if 0
      trace("Num clusters: %u, Average blocks per cluster: %u, Max blocks per cluster: %u\n",
         m_endpoint_cluster_indices.size(),
         total_blocks / m_endpoint_cluster_indices.size(),
         max_blocks);
#endif

        crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices = m_cached_selector_cluster_indices[params.m_quality_level];

        m_progress_start = 0;
        if (quality >= 1.0f)
        {
            m_progress_range = 100;
        }
        else if (selector_cluster_indices.empty())
        {
            m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 33;
        }
        else
        {
            m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 50;
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &qdxt1::pack_endpoints_task, i);
        }
        m_pTask_pool->join();

        if (m_canceled)
        {
            return false;
        }

        if (quality >= 1.0f)
        {
            return true;
        }

        if (selector_cluster_indices.empty())
        {
            create_selector_clusters(max_selector_clusters, selector_cluster_indices);

            if (m_canceled)
            {
                selector_cluster_indices.clear();

                return false;
            }
        }

        m_progress_start += m_progress_range;
        m_progress_range = 100 - m_progress_start;

        optimize_selectors_params optimize_selectors_task_params(selector_cluster_indices);

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &qdxt1::optimize_selectors_task, i, &optimize_selectors_task_params);
        }

        m_pTask_pool->join();

        return !m_canceled;
    }